

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

void evutil_adjust_hints_for_addrconfig_(addrinfo *hints)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long *plVar4;
  socklen_t local_80;
  socklen_t sin_out_len;
  sockaddr_in sin_out;
  sockaddr_in6 sin6_out;
  undefined1 local_48 [20];
  undefined8 local_34;
  sockaddr local_28;
  
  if (((hints->ai_flags & 0x20) != 0) && (hints->ai_family == 0)) {
    sin_out_len = 0x10;
    local_80 = 0x1c;
    if (have_checked_interfaces == '\0') {
      have_checked_interfaces = '\x01';
      plVar4 = (long *)local_48;
      local_48._0_2_ = 0;
      local_48[2] = '\0';
      local_48[3] = '\0';
      local_48[4] = '\0';
      local_48[5] = '\0';
      local_48[6] = '\0';
      local_48[7] = '\0';
      iVar1 = getifaddrs(plVar4);
      if (iVar1 < 0) {
        event_warn("Unable to call getifaddrs()");
        local_28.sa_data[2] = '\0';
        local_28.sa_data[3] = '\0';
        local_28.sa_data[4] = '\0';
        local_28.sa_data[5] = '\0';
        local_28.sa_data[6] = '\0';
        local_28.sa_data[7] = '\0';
        local_28.sa_data[8] = '\0';
        local_28.sa_data[9] = '\0';
        local_28.sa_data[10] = '\0';
        local_28.sa_data[0xb] = '\0';
        local_28.sa_data[0xc] = '\0';
        local_28.sa_data[0xd] = '\0';
        local_28.sa_family = 2;
        local_28.sa_data[0] = '\0';
        local_28.sa_data[1] = '5';
        iVar1 = evutil_inet_pton(2,"18.244.0.188",local_28.sa_data + 2);
        if (iVar1 == 0) {
          uVar3 = 0x30e;
LAB_0020475e:
          event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
                     ,uVar3,"r","evutil_check_interfaces");
        }
        local_48[4] = '\0';
        local_48[5] = '\0';
        local_48[6] = '\0';
        local_48[7] = '\0';
        local_48[8] = '\0';
        local_48[9] = '\0';
        local_48[10] = '\0';
        local_48[0xb] = '\0';
        local_48._12_8_ = 0;
        local_34 = 0;
        local_48._0_2_ = 10;
        local_48[2] = '\0';
        local_48[3] = '5';
        iVar1 = evutil_inet_pton(10,"2001:4860:b002::68",local_48 + 8);
        if (iVar1 == 0) {
          uVar3 = 0x314;
          goto LAB_0020475e;
        }
        sin_out.sin_family = 0;
        sin_out.sin_port = 0;
        sin_out.sin_addr.s_addr = 0;
        sin_out.sin_zero[0] = '\0';
        sin_out.sin_zero[1] = '\0';
        sin_out.sin_zero[2] = '\0';
        sin_out.sin_zero[3] = '\0';
        sin_out.sin_zero[4] = '\0';
        sin_out.sin_zero[5] = '\0';
        sin_out.sin_zero[6] = '\0';
        sin_out.sin_zero[7] = '\0';
        sin6_out.sin6_family = 0;
        sin6_out.sin6_port = 0;
        sin6_out.sin6_flowinfo = 0;
        sin6_out.sin6_addr.__in6_u.__u6_addr32[0] = 0;
        sin6_out.sin6_addr.__in6_u.__u6_addr32[1] = 0;
        sin6_out.sin6_addr.__in6_u.__u6_addr32[2] = 0;
        sin6_out._20_8_ = 0;
        iVar1 = socket(2,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,&local_28,0x10);
          if ((iVar2 == 0) &&
             (iVar2 = getsockname(iVar1,(sockaddr *)&sin_out,&sin_out_len), iVar2 == 0)) {
            evutil_found_ifaddr((sockaddr *)&sin_out);
          }
          close(iVar1);
        }
        iVar1 = socket(10,2,0x11);
        if (-1 < iVar1) {
          iVar2 = connect(iVar1,(sockaddr *)local_48,0x1c);
          if ((iVar2 == 0) &&
             (iVar2 = getsockname(iVar1,(sockaddr *)&sin6_out,&local_80), iVar2 == 0)) {
            evutil_found_ifaddr((sockaddr *)&sin6_out);
          }
          close(iVar1);
        }
      }
      else {
        while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
          if ((sockaddr *)plVar4[3] != (sockaddr *)0x0) {
            evutil_found_ifaddr((sockaddr *)plVar4[3]);
          }
        }
        freeifaddrs(CONCAT44(local_48._4_4_,local_48._0_4_));
      }
    }
    if (((had_ipv4_address ^ 1 | had_ipv6_address) & 1) == 0) {
      iVar1 = 2;
    }
    else {
      if (((had_ipv4_address ^ 1) & had_ipv6_address & 1) == 0) {
        return;
      }
      iVar1 = 10;
    }
    hints->ai_family = iVar1;
  }
  return;
}

Assistant:

void
evutil_adjust_hints_for_addrconfig_(struct evutil_addrinfo *hints)
{
	if (!(hints->ai_flags & EVUTIL_AI_ADDRCONFIG))
		return;
	if (hints->ai_family != PF_UNSPEC)
		return;
	evutil_check_interfaces();
	if (had_ipv4_address && !had_ipv6_address) {
		hints->ai_family = PF_INET;
	} else if (!had_ipv4_address && had_ipv6_address) {
		hints->ai_family = PF_INET6;
	}
}